

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,decimal_fp<float> *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  uint uVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  iterator it;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  char cVar10;
  significand_type sVar11;
  uint uVar12;
  size_t n;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_7d [5];
  sign_t local_78;
  int local_74;
  uint local_70;
  undefined1 local_6c [4];
  decimal_fp<float> local_68;
  anon_class_56_7_a2a26a24 local_60;
  
  local_70 = fp->significand;
  uVar12 = 0x1f;
  if ((local_70 | 1) != 0) {
    for (; (local_70 | 1) >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  local_74 = (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar12 * 2) -
             (uint)(local_70 <
                   *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                            (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar12 * 2) * 4));
  uVar1 = fspecs._4_4_;
  local_78 = uVar1 >> 8 & 0xff;
  uVar5 = (ulong)((uint)(local_78 != none) + local_74);
  uVar12 = fp->exponent;
  sVar11 = uVar12 + local_74;
  uVar3 = fspecs.precision;
  local_7d[0] = decimal_point;
  local_68 = (decimal_fp<float>)fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_0019385c:
    iVar8 = uVar12 + local_74 + -1;
    if ((uVar1 >> 0x14 & 1) == 0) {
      uVar4 = 0;
      uVar6 = (ulong)(byte)decimal_point;
      if (local_74 == 1) {
        uVar6 = uVar4;
      }
      cVar10 = (char)uVar6;
    }
    else {
      uVar4 = 0;
      if (0 < (int)(uVar3 - local_74)) {
        uVar4 = (ulong)(uVar3 - local_74);
      }
      uVar5 = uVar5 + uVar4;
      cVar10 = decimal_point;
    }
    local_60.sign = (sign_t *)(CONCAT44(local_70,uVar1 >> 8) & 0xffffffff000000ff);
    local_60.significand._0_5_ = CONCAT14(cVar10,local_74);
    local_60.significand_size =
         (int *)(CONCAT35(local_60.significand_size._5_3_,
                          CONCAT14(((uVar1 >> 0x10 & 1) == 0) << 5,(int)uVar4)) | 0x4500000000);
    local_60.fp = (decimal_fp<float> *)CONCAT44(local_60.fp._4_4_,iVar8);
    uVar4 = (ulong)specs->width;
    if ((long)uVar4 < 1) {
      bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
              ::anon_class_28_7_94dcc806::operator()
                        ((anon_class_28_7_94dcc806 *)&local_60,out.container);
      return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
    }
    if ((int)sVar11 < 1) {
      iVar8 = 1 - sVar11;
    }
    lVar9 = 2;
    if (99 < iVar8) {
      lVar9 = (ulong)(999 < iVar8) + 3;
    }
    uVar6 = uVar5 + (3 - (ulong)(cVar10 == '\0')) + lVar9;
    uVar5 = 0;
    if (uVar6 <= uVar4) {
      uVar5 = uVar4 - uVar6;
    }
    uVar4 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (out,uVar4,&specs->fill);
    it.container = (buffer<char> *)
                   write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                   ::anon_class_28_7_94dcc806::operator()
                             ((anon_class_28_7_94dcc806 *)&local_60,bVar2.container);
    n = uVar5 - uVar4;
    goto LAB_00193a95;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    uVar7 = 0x10;
    if (0 < (int)uVar3) {
      uVar7 = uVar3;
    }
    if (((int)sVar11 < -3) || ((int)uVar7 < (int)sVar11)) goto LAB_0019385c;
  }
  local_6c = (undefined1  [4])sVar11;
  if ((int)uVar12 < 0) {
    if (0 < (int)sVar11) {
      local_7d._1_4_ = uVar3 - local_74 & (int)(uVar1 << 0xb) >> 0x1f;
      local_60.decimal_point = local_7d + 1;
      uVar4 = (ulong)(uint)local_7d._1_4_;
      if ((int)local_7d._1_4_ < 1) {
        uVar4 = 0;
      }
      uVar4 = uVar4 + uVar5 + 1;
      local_60.sign = &local_78;
      local_60.significand = &local_70;
      local_60.significand_size = &local_74;
      local_60.fp = (decimal_fp<float> *)local_6c;
      local_60.fspecs = (float_specs *)local_7d;
      uVar5 = 0;
      if (uVar4 <= (uint)specs->width) {
        uVar5 = (uint)specs->width - uVar4;
      }
      uVar4 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                 (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
      bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                        (out,uVar4,&specs->fill);
      it.container = (buffer<char> *)
                     write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                     ::anon_class_48_6_48d028d1::operator()
                               ((anon_class_48_6_48d028d1 *)&local_60,bVar2.container);
      n = uVar5 - uVar4;
      goto LAB_00193a95;
    }
    uVar12 = -sVar11;
    local_7d._1_4_ = uVar12;
    if (SBORROW4(uVar3,uVar12) != (int)(uVar3 + sVar11) < 0) {
      local_7d._1_4_ = uVar3;
    }
    if ((int)uVar3 < 0) {
      local_7d._1_4_ = uVar12;
    }
    if (local_74 != 0) {
      local_7d._1_4_ = uVar12;
    }
    local_60.significand = (significand_type *)(local_7d + 1);
    uVar5 = (local_7d._1_4_ + 2) + uVar5;
    local_60.sign = &local_78;
    local_60.significand_size = &local_74;
    local_60.fp = &local_68;
    local_60.fspecs = (float_specs *)local_7d;
    local_60.decimal_point = (char *)&local_70;
    uVar4 = 0;
    if (uVar5 <= (uint)specs->width) {
      uVar4 = (uint)specs->width - uVar5;
    }
    uVar5 = uVar4 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (out,uVar5,&specs->fill);
    it = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
         ::anon_class_48_6_9afe1116::operator()
                   ((anon_class_48_6_9afe1116 *)&local_60,bVar2.container);
  }
  else {
    uVar5 = uVar5 + uVar12;
    local_7d._1_4_ = uVar3 - sVar11;
    if ((uVar1 >> 0x14 & 1) != 0) {
      if ((fspecs._4_1_ == '\x02') || (0 < (int)local_7d._1_4_)) {
        if ((int)local_7d._1_4_ < 1) goto LAB_00193a0e;
      }
      else {
        local_7d._1_4_ = 1;
      }
      uVar5 = uVar5 + (uint)local_7d._1_4_;
    }
LAB_00193a0e:
    local_60.sign = &local_78;
    local_60.significand = &local_70;
    local_60.significand_size = &local_74;
    local_60.fspecs = (float_specs *)&local_68;
    local_60.decimal_point = local_7d;
    local_60.num_zeros = (int *)(local_7d + 1);
    uVar4 = 0;
    if (uVar5 <= (uint)specs->width) {
      uVar4 = (uint)specs->width - uVar5;
    }
    uVar5 = uVar4 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    local_60.fp = fp;
    bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (out,uVar5,&specs->fill);
    it = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
         ::anon_class_56_7_a2a26a24::operator()(&local_60,bVar2.container);
  }
  n = uVar4 - uVar5;
LAB_00193a95:
  bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (it.container,n,&specs->fill);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}